

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderBarrier.cpp
# Opt level: O2

char * __thiscall glcts::TessellationShaderBarrier1::getVSCode(TessellationShaderBarrier1 *this)

{
  return 
  "${VERSION}\n\nflat out int vertex_id;\n\nvoid main()\n{\n    vertex_id = gl_VertexID;\n}\n";
}

Assistant:

const char* TessellationShaderBarrier1::getVSCode()
{
	static const char* vs_code = "${VERSION}\n"
								 "\n"
								 "flat out int vertex_id;\n"
								 "\n"
								 "void main()\n"
								 "{\n"
								 "    vertex_id = gl_VertexID;\n"
								 "}\n";

	return vs_code;
}